

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O3

ecs_vector_t *
ecs_table_set_column(ecs_world_t *world,ecs_table_t *table,int32_t column,ecs_vector_t *vector)

{
  ecs_vector_t *vector_00;
  int32_t elem_count;
  ecs_column_t *peVar1;
  ecs_column_t *peVar2;
  int16_t iVar3;
  ecs_vector_t *local_30;
  
  peVar1 = da_get_or_create_column(world,table,column);
  if (vector == (ecs_vector_t *)0x0) {
    if ((table->data == (ecs_data_t *)0x0) ||
       (vector_00 = table->data->entities, vector_00 == (ecs_vector_t *)0x0)) {
      vector = (ecs_vector_t *)0x0;
    }
    else {
      elem_count = ecs_vector_count(vector_00);
      peVar2 = da_get_column(table,column);
      if ((peVar2 == (ecs_column_t *)0x0) ||
         (local_30 = peVar2->data, local_30 == (ecs_vector_t *)0x0)) {
        iVar3 = 0x10;
        if (0x10 < peVar1->alignment) {
          iVar3 = peVar1->alignment;
        }
        vector = _ecs_vector_new((int)peVar1->size,iVar3,elem_count);
      }
      else {
        iVar3 = 0x10;
        if (0x10 < peVar1->alignment) {
          iVar3 = peVar1->alignment;
        }
        _ecs_vector_set_count(&local_30,(int)peVar1->size,iVar3,elem_count);
        vector = local_30;
      }
    }
  }
  else {
    ecs_vector_assert_size(vector,(int)peVar1->size);
  }
  peVar1->data = vector;
  return vector;
}

Assistant:

ecs_vector_t* ecs_table_set_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column,
    ecs_vector_t* vector)
{
    ecs_column_t *c = da_get_or_create_column(world, table, column);
    if (vector) {
        ecs_vector_assert_size(vector, c->size);
    } else {
        ecs_vector_t *entities = ecs_table_get_entities(table);
        if (entities) {
            int32_t count = ecs_vector_count(entities);
            vector = ecs_table_get_column(table, column);
            if (!vector) {
                vector = ecs_vector_new_t(c->size, c->alignment, count);
            } else {
                ecs_vector_set_count_t(&vector, c->size, c->alignment, count);
            }
        }
    }
    c->data = vector;
    
    return vector;
}